

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O3

void __thiscall
DISTRHO::PluginExporter::run(PluginExporter *this,float **inputs,float **outputs,uint32_t frames)

{
  PrivateData *pPVar1;
  undefined8 uVar2;
  char *pcVar3;
  Plugin *pPVar4;
  
  pPVar1 = this->fData;
  if (pPVar1 == (PrivateData *)0x0) {
    pcVar3 = "fData != nullptr";
    uVar2 = 0x354;
  }
  else {
    pPVar4 = this->fPlugin;
    if (pPVar4 != (Plugin *)0x0) {
      if (this->fIsActive == false) {
        this->fIsActive = true;
        (*pPVar4->_vptr_Plugin[0xf])();
        pPVar4 = this->fPlugin;
        pPVar1 = this->fData;
      }
      pPVar1->isProcessing = true;
      (*pPVar4->_vptr_Plugin[0x11])(pPVar4,inputs,outputs,(ulong)frames);
      this->fData->isProcessing = false;
      return;
    }
    pcVar3 = "fPlugin != nullptr";
    uVar2 = 0x355;
  }
  d_stderr2("assertion failure: \"%s\" in file %s, line %i",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
            ,uVar2);
  return;
}

Assistant:

void run(const float** const inputs, float** const outputs, const uint32_t frames)
    {
        DISTRHO_SAFE_ASSERT_RETURN(fData != nullptr,);
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr,);

        if (! fIsActive)
        {
            fIsActive = true;
            fPlugin->activate();
        }

        fData->isProcessing = true;
        fPlugin->run(inputs, outputs, frames);
        fData->isProcessing = false;
    }